

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchSet.cpp
# Opt level: O0

void Hpipe::anon_unknown_5::get_mean_depth_rec(double *sum,double *wgt,Node *node,double depth)

{
  bool bVar1;
  Node *pNVar2;
  double depth_local;
  Node *node_local;
  double *wgt_local;
  double *sum_local;
  
  bVar1 = AutoPtr::operator_cast_to_bool((AutoPtr *)&node->ok);
  if (bVar1) {
    pNVar2 = AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::ptr(&node->ok);
    get_mean_depth_rec(sum,wgt,pNVar2,depth + 1.0);
  }
  bVar1 = AutoPtr::operator_cast_to_bool((AutoPtr *)&node->ko);
  if (bVar1) {
    pNVar2 = AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::ptr(&node->ko);
    get_mean_depth_rec(sum,wgt,pNVar2,depth + 1.0);
  }
  bVar1 = AutoPtr::operator_cast_to_bool((AutoPtr *)&node->ok);
  if ((!bVar1) && (bVar1 = AutoPtr::operator_cast_to_bool((AutoPtr *)&node->ko), !bVar1)) {
    *sum = node->freq * depth + *sum;
    *wgt = node->freq + *wgt;
  }
  return;
}

Assistant:

static void get_mean_depth_rec( double &sum, double &wgt, const BranchSet::Node *node, double depth ) {
    if ( node->ok )
        get_mean_depth_rec( sum, wgt, node->ok.ptr(), depth + 1 );
    if ( node->ko )
        get_mean_depth_rec( sum, wgt, node->ko.ptr(), depth + 1 );
    if ( ! node->ok && ! node->ko ) {
        sum += node->freq * depth;
        wgt += node->freq;
    }
}